

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute(XmlWriter *this,StringRef name,StringRef attribute)

{
  StringRef str;
  StringRef str_00;
  bool bVar1;
  ostream *poVar2;
  char *in_RCX;
  size_type in_RDX;
  char *in_RSI;
  XmlWriter *in_RDI;
  size_type in_R8;
  XmlEncode *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffffa0;
  XmlEncode local_50;
  char *local_38;
  size_type local_30;
  StringRef local_20;
  StringRef local_10;
  
  local_20.m_start = in_RCX;
  local_20.m_size = in_R8;
  local_10.m_start = in_RSI;
  local_10.m_size = in_RDX;
  bVar1 = StringRef::empty(&local_10);
  if (!bVar1) {
    bVar1 = StringRef::empty(&local_20);
    if (!bVar1) {
      std::operator<<(in_RDI->m_os,' ');
      local_38 = local_10.m_start;
      local_30 = local_10.m_size;
      str.m_size = in_stack_ffffffffffffffa0;
      str.m_start = &in_RDI->m_tagIsOpen;
      poVar2 = Catch::operator<<(in_stack_ffffffffffffff90,str);
      poVar2 = std::operator<<(poVar2,"=\"");
      str_00.m_size = local_20.m_size;
      str_00.m_start = local_20.m_start;
      XmlEncode::XmlEncode(&local_50,str_00,ForAttributes);
      poVar2 = Catch::operator<<(poVar2,in_stack_ffffffffffffff88);
      std::operator<<(poVar2,'\"');
    }
  }
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( StringRef name,
                                          StringRef attribute ) {
        if( !name.empty() && !attribute.empty() )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }